

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

either * toml::detail::syntax::allowed_comment_char(either *__return_storage_ptr__,spec *s)

{
  non_ascii nStack_68;
  character_in_range local_40;
  character_in_range local_30;
  
  if (s->v1_1_0_allow_control_characters_in_comments == true) {
    local_30.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00568888;
    local_30.from_ = '\x01';
    local_30.to_ = '\t';
    local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00568888;
    local_40.from_ = '\x0e';
    local_40.to_ = '\x7f';
    non_ascii::non_ascii(&nStack_68,s);
    either::
    either<toml::detail::character_in_range,toml::detail::character_in_range,toml::detail::syntax::non_ascii>
              (__return_storage_ptr__,&local_30,&local_40,&nStack_68);
  }
  else {
    local_30.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005687c8;
    local_30.from_ = '\t';
    local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00568888;
    local_40.from_ = ' ';
    local_40.to_ = '~';
    non_ascii::non_ascii(&nStack_68,s);
    either::
    either<toml::detail::character,toml::detail::character_in_range,toml::detail::syntax::non_ascii>
              (__return_storage_ptr__,(character *)&local_30,&local_40,&nStack_68);
  }
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&nStack_68.scanner_.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE either allowed_comment_char(const spec& s)
{
    if(s.v1_1_0_allow_control_characters_in_comments)
    {
        return either(
            character_in_range(0x01, 0x09),
            character_in_range(0x0E, 0x7F),
            non_ascii(s)
        );
    }
    else
    {
        return either(
            character(0x09),
            character_in_range(0x20, 0x7E),
            non_ascii(s)
        );
    }
}